

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall myvk::Buffer::~Buffer(Buffer *this)

{
  element_type *this_00;
  undefined8 *in_RDI;
  VmaAllocation unaff_retaddr;
  VkBuffer in_stack_00000008;
  
  *in_RDI = &PTR__Buffer_00530298;
  if (in_RDI[3] != 0) {
    this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2aa936);
    Device::GetAllocatorHandle(this_00);
    vmaDestroyBuffer((VmaAllocator)this,in_stack_00000008,unaff_retaddr);
  }
  std::shared_ptr<myvk::Device>::~shared_ptr((shared_ptr<myvk::Device> *)0x2aa96c);
  BufferBase::~BufferBase((BufferBase *)0x2aa976);
  return;
}

Assistant:

Buffer::~Buffer() {
	if (m_buffer)
		vmaDestroyBuffer(m_device_ptr->GetAllocatorHandle(), m_buffer, m_allocation);
}